

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsModuleEvaluation(JsModuleRecord requestModule,JsValueRef *result)

{
  anon_class_16_2_78a6bfb9 fn;
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  JsrtContext *newContext;
  JsErrorCode errorCode;
  JsrtContext *jsrtContext;
  ScriptContext *scriptContext;
  SourceTextModuleRecord *moduleRecord;
  JsValueRef *result_local;
  JsModuleRecord requestModule_local;
  
  moduleRecord = (SourceTextModuleRecord *)result;
  result_local = (JsValueRef *)requestModule;
  bVar1 = Js::SourceTextModuleRecord::Is(requestModule);
  if (bVar1) {
    scriptContext = (ScriptContext *)Js::SourceTextModuleRecord::FromHost(result_local);
    if (moduleRecord != (SourceTextModuleRecord *)0x0) {
      (moduleRecord->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject = (_func_int **)0x0;
    }
    this = Js::SourceTextModuleRecord::GetScriptContext((SourceTextModuleRecord *)scriptContext);
    this_00 = Js::ScriptContext::GetLibrary(this);
    newContext = (JsrtContext *)Js::JavascriptLibrary::GetJsrtContext(this_00);
    fn.result = (JsValueRef **)&moduleRecord;
    fn.moduleRecord = (SourceTextModuleRecord **)&scriptContext;
    requestModule_local._4_4_ = SetContextAPIWrapper<JsModuleEvaluation::__0>(newContext,fn);
  }
  else {
    requestModule_local._4_4_ = JsErrorInvalidArgument;
  }
  return requestModule_local._4_4_;
}

Assistant:

CHAKRA_API
JsModuleEvaluation(
    _In_ JsModuleRecord requestModule,
    _Outptr_result_maybenull_ JsValueRef* result)
{
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        return JsErrorInvalidArgument;
    }
    Js::SourceTextModuleRecord* moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
    if (result != nullptr)
    {
        *result = JS_INVALID_REFERENCE;
    }
    Js::ScriptContext* scriptContext = moduleRecord->GetScriptContext();
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        SmartFPUControl smartFpuControl;
        if (smartFpuControl.HasErr())
        {
            return JsErrorBadFPUState;
        }
        JsValueRef returnRef = moduleRecord->ModuleEvaluation();
        if (result != nullptr)
        {
            *result = returnRef;
        }
        return JsNoError;
    });
    return errorCode;
}